

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

ExprList * sqlite3ExprListAppendVector(Parse *pParse,ExprList *pList,IdList *pColumns,Expr *pExpr)

{
  uint uVar1;
  int nField;
  sqlite3 *db;
  uint uVar2;
  Expr *pEVar3;
  long lVar4;
  long lVar5;
  
  if (pList == (ExprList *)0x0) {
    lVar4 = 0;
  }
  else {
    lVar4 = (long)pList->nExpr;
  }
  db = pParse->db;
  if (pExpr != (Expr *)0x0 && pColumns != (IdList *)0x0) {
    if (pExpr->op != 0x8b) {
      uVar1 = pColumns->nId;
      uVar2 = sqlite3ExprVectorSize(pExpr);
      if (uVar1 != uVar2) {
        sqlite3ErrorMsg(pParse,"%d columns assigned %d values",(ulong)uVar1,(ulong)uVar2);
        goto LAB_00169c0d;
      }
    }
    for (lVar5 = 0; nField = pColumns->nId, lVar5 < nField; lVar5 = lVar5 + 1) {
      pEVar3 = sqlite3ExprForVectorField(pParse,pExpr,(int)lVar5,nField);
      if (pEVar3 != (Expr *)0x0) {
        pList = sqlite3ExprListAppend(pParse,pList,pEVar3);
        if (pList == (ExprList *)0x0) {
          pList = (ExprList *)0x0;
        }
        else {
          pList->a[(long)pList->nExpr + -1].zEName = pColumns->a[lVar5].zName;
          pColumns->a[lVar5].zName = (char *)0x0;
        }
      }
    }
    if (((db->mallocFailed == '\0') && (pExpr->op == 0x8b)) && (pList != (ExprList *)0x0)) {
      pEVar3 = pList->a[lVar4].pExpr;
      pEVar3->pRight = pExpr;
      pEVar3->iTable = nField;
      pExpr = (Expr *)0x0;
    }
  }
LAB_00169c0d:
  sqlite3ExprUnmapAndDelete(pParse,pExpr);
  sqlite3IdListDelete(db,pColumns);
  return pList;
}

Assistant:

SQLITE_PRIVATE ExprList *sqlite3ExprListAppendVector(
  Parse *pParse,         /* Parsing context */
  ExprList *pList,       /* List to which to append. Might be NULL */
  IdList *pColumns,      /* List of names of LHS of the assignment */
  Expr *pExpr            /* Vector expression to be appended. Might be NULL */
){
  sqlite3 *db = pParse->db;
  int n;
  int i;
  int iFirst = pList ? pList->nExpr : 0;
  /* pColumns can only be NULL due to an OOM but an OOM will cause an
  ** exit prior to this routine being invoked */
  if( NEVER(pColumns==0) ) goto vector_append_error;
  if( pExpr==0 ) goto vector_append_error;

  /* If the RHS is a vector, then we can immediately check to see that
  ** the size of the RHS and LHS match.  But if the RHS is a SELECT,
  ** wildcards ("*") in the result set of the SELECT must be expanded before
  ** we can do the size check, so defer the size check until code generation.
  */
  if( pExpr->op!=TK_SELECT && pColumns->nId!=(n=sqlite3ExprVectorSize(pExpr)) ){
    sqlite3ErrorMsg(pParse, "%d columns assigned %d values",
                    pColumns->nId, n);
    goto vector_append_error;
  }

  for(i=0; i<pColumns->nId; i++){
    Expr *pSubExpr = sqlite3ExprForVectorField(pParse, pExpr, i, pColumns->nId);
    assert( pSubExpr!=0 || db->mallocFailed );
    if( pSubExpr==0 ) continue;
    pList = sqlite3ExprListAppend(pParse, pList, pSubExpr);
    if( pList ){
      assert( pList->nExpr==iFirst+i+1 );
      pList->a[pList->nExpr-1].zEName = pColumns->a[i].zName;
      pColumns->a[i].zName = 0;
    }
  }

  if( !db->mallocFailed && pExpr->op==TK_SELECT && ALWAYS(pList!=0) ){
    Expr *pFirst = pList->a[iFirst].pExpr;
    assert( pFirst!=0 );
    assert( pFirst->op==TK_SELECT_COLUMN );

    /* Store the SELECT statement in pRight so it will be deleted when
    ** sqlite3ExprListDelete() is called */
    pFirst->pRight = pExpr;
    pExpr = 0;

    /* Remember the size of the LHS in iTable so that we can check that
    ** the RHS and LHS sizes match during code generation. */
    pFirst->iTable = pColumns->nId;
  }

vector_append_error:
  sqlite3ExprUnmapAndDelete(pParse, pExpr);
  sqlite3IdListDelete(db, pColumns);
  return pList;
}